

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
::NewKey(TMap<FPortalID,_TArray<FPortalSector,_FPortalSector>,_THashTraits<FPortalID>,_TValueTraits<TArray<FPortalSector,_FPortalSector>_>_>
         *this,FPortalID *key)

{
  double dVar1;
  FPortalSector *pFVar2;
  uint uVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  FPortalID local_58;
  FPortalID local_48;
  FPortalID local_38;
  
  local_38.mDisplacement.X = (key->mDisplacement).X;
  local_38.mDisplacement.Y = (key->mDisplacement).Y;
  pNVar4 = MainPosition(this,&local_38);
  if (pNVar4->Next != (Node *)0x1) {
    pNVar5 = GetFreePos(this);
    if (pNVar5 == (Node *)0x0) {
      Rehash(this);
      local_48.mDisplacement.X = (key->mDisplacement).X;
      local_48.mDisplacement.Y = (key->mDisplacement).Y;
      pNVar4 = NewKey(this,&local_48);
      return pNVar4;
    }
    local_58.mDisplacement.X = (pNVar4->Pair).Key.mDisplacement.X;
    local_58.mDisplacement.Y = (pNVar4->Pair).Key.mDisplacement.Y;
    pNVar6 = MainPosition(this,&local_58);
    if (pNVar6 == pNVar4) {
      pNVar5->Next = pNVar4->Next;
      pNVar6 = pNVar5;
      goto LAB_0038c53d;
    }
    do {
      pNVar7 = pNVar6;
      pNVar6 = pNVar7->Next;
    } while (pNVar6 != pNVar4);
    pNVar7->Next = pNVar5;
    uVar3 = (pNVar4->Pair).Value.Count;
    (pNVar5->Pair).Value.Most = (pNVar4->Pair).Value.Most;
    (pNVar5->Pair).Value.Count = uVar3;
    pNVar6 = pNVar4->Next;
    dVar1 = (pNVar4->Pair).Key.mDisplacement.X;
    pFVar2 = (pNVar4->Pair).Value.Array;
    (pNVar5->Pair).Key.mDisplacement.Y = (pNVar4->Pair).Key.mDisplacement.Y;
    (pNVar5->Pair).Value.Array = pFVar2;
    pNVar5->Next = pNVar6;
    (pNVar5->Pair).Key.mDisplacement.X = dVar1;
  }
  pNVar5 = pNVar4;
  pNVar6 = (Node *)0x0;
LAB_0038c53d:
  pNVar4->Next = pNVar6;
  this->NumUsed = this->NumUsed + 1;
  dVar1 = (key->mDisplacement).Y;
  (pNVar5->Pair).Key.mDisplacement.X = (key->mDisplacement).X;
  (pNVar5->Pair).Key.mDisplacement.Y = dVar1;
  return pNVar5;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}